

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O1

void Saig_ManAnalizeControl(Aig_Man_t *p,int Reg)

{
  int iVar1;
  void **ppvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObj;
  uint uVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  uint uVar8;
  Aig_Obj_t *pObj_00;
  
  uVar8 = Reg + p->nTruePis;
  if (-1 < (int)uVar8) {
    iVar1 = p->vCis->nSize;
    if ((((int)uVar8 < iVar1) && (uVar4 = (p->nTruePis + p->nRegs) - 1, -1 < (int)uVar4)) &&
       ((int)uVar4 < iVar1)) {
      ppvVar2 = p->vCis->pArray;
      pAVar3 = (Aig_Obj_t *)ppvVar2[uVar8];
      pObj = (Aig_Obj_t *)ppvVar2[uVar4];
      if (pObj->Id <= pAVar3->Id) {
        __assert_fail("pReg->Id < pCtrl->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                      ,0x26a,"void Saig_ManAnalizeControl(Aig_Man_t *, int)");
      }
      lVar5 = (long)p->vObjs->nSize;
      if (0 < lVar5) {
        lVar7 = 0;
        do {
          pObj_00 = (Aig_Obj_t *)p->vObjs->pArray[lVar7];
          if (((pObj_00 != (Aig_Obj_t *)0x0) &&
              (0xfffffffd < (*(uint *)&pObj_00->field_0x18 & 7) - 7)) &&
             ((pAVar3 == (Aig_Obj_t *)((ulong)pObj_00->pFanin0 & 0xfffffffffffffffe) &&
              (pObj == (Aig_Obj_t *)((ulong)pObj_00->pFanin1 & 0xfffffffffffffffe)))))
          goto LAB_006307a7;
          lVar7 = lVar7 + 1;
        } while (lVar5 != lVar7);
      }
      pObj_00 = (Aig_Obj_t *)0x0;
LAB_006307a7:
      if (pObj_00 != (Aig_Obj_t *)0x0) {
        puts("Clock-like register: ");
        Aig_ObjPrint(p,pAVar3);
        putchar(10);
        puts("Control register: ");
        Aig_ObjPrint(p,pObj);
        putchar(10);
        puts("Their fanout: ");
        Aig_ObjPrint(p,pObj_00);
        putchar(10);
        puts("Fanouts of the fanout: ");
        pVVar6 = p->vObjs;
        if (0 < pVVar6->nSize) {
          lVar5 = 0;
          do {
            pAVar3 = (Aig_Obj_t *)pVVar6->pArray[lVar5];
            if ((pAVar3 != (Aig_Obj_t *)0x0) &&
               ((pObj_00 == (Aig_Obj_t *)((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe) ||
                (pObj_00 == (Aig_Obj_t *)((ulong)pAVar3->pFanin1 & 0xfffffffffffffffe))))) {
              Aig_ObjPrint(p,pAVar3);
              putchar(10);
            }
            lVar5 = lVar5 + 1;
            pVVar6 = p->vObjs;
          } while (lVar5 < pVVar6->nSize);
        }
        putchar(10);
        return;
      }
      puts("Register is not found.");
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Saig_ManAnalizeControl( Aig_Man_t * p, int Reg )
{
    Aig_Obj_t * pObj, * pReg, * pCtrl, * pAnd;
    int i;
    pReg = Saig_ManLo( p, Reg );
    pCtrl = Saig_ManLo( p, Saig_ManRegNum(p)-1 );
    assert( pReg->Id < pCtrl->Id );
    // find a node pointing to both
    pAnd = NULL;
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Aig_ObjFanin0(pObj) == pReg && Aig_ObjFanin1(pObj) == pCtrl )
        {
            pAnd = pObj;
            break;
        }
    }
    if ( pAnd == NULL )
    {
        printf( "Register is not found.\n" );
        return;
    }
    printf( "Clock-like register: \n" );
    Aig_ObjPrint( p, pReg );
    printf( "\n" );
    printf( "Control register: \n" );
    Aig_ObjPrint( p, pCtrl );
    printf( "\n" );
    printf( "Their fanout: \n" );
    Aig_ObjPrint( p, pAnd );
    printf( "\n" );
 
    // find the fanouts of pAnd
    printf( "Fanouts of the fanout: \n" );
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjFanin0(pObj) == pAnd || Aig_ObjFanin1(pObj) == pAnd )
        {
            Aig_ObjPrint( p, pObj );
            printf( "\n" );
        }
    printf( "\n" );
}